

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

CESkyCoord * __thiscall
CESkyCoord::ConvertToGalactic(CESkyCoord *this,CEDate *date,CEObserver *observer)

{
  CEObserver *in_RDX;
  CEDate *in_RSI;
  CESkyCoord *in_RDI;
  CESkyCoord *unaff_retaddr;
  CESkyCoord *galactic;
  CESkyCoord *in_stack_000000c8;
  CESkyCoord *in_stack_000000d0;
  CESkyCoord *in_stack_ffffffffffffffa8;
  CESkyCoord *this_00;
  CESkyCoord *in_stack_ffffffffffffffd0;
  CEDate *date_00;
  CESkyCoord *out_galactic;
  
  this_00 = in_RDI;
  date_00 = in_RSI;
  out_galactic = in_RDI;
  CESkyCoord(in_stack_ffffffffffffffd0);
  if (*(int *)&(in_RSI->gregorian_date_vect_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish == 0) {
    CIRS2Galactic(this_00,in_stack_ffffffffffffffa8,(CEDate *)0x1652b8);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 1) {
    ICRS2Galactic(in_stack_000000d0,in_stack_000000c8);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 2) {
    SetCoordinates(this_00,in_stack_ffffffffffffffa8);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 3) {
    Observed2Galactic(unaff_retaddr,out_galactic,date_00,in_RDX);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 4) {
    Ecliptic2Galactic(unaff_retaddr,out_galactic,date_00);
  }
  return in_RDI;
}

Assistant:

CESkyCoord CESkyCoord::ConvertToGalactic(const CEDate&     date,
                                         const CEObserver& observer)
{
    // Create return coordiantes
    CESkyCoord galactic;

    // Convert
    if (coord_type_ == CESkyCoordType::CIRS) {
        // CIRS -> GALACTIC
        CIRS2Galactic(*this, &galactic, date);
    } else if (coord_type_ == CESkyCoordType::ICRS) {
        // ICRS -> GALACTIC
        ICRS2Galactic(*this, &galactic);
    } else if (coord_type_ == CESkyCoordType::GALACTIC) {
        // GALACTIC -> GALACTIC
        galactic.SetCoordinates(*this);
    } else if (coord_type_ == CESkyCoordType::OBSERVED) {
        // OBSERVED -> GALACTIC
        Observed2Galactic(*this, &galactic, date, observer);
    } else if (coord_type_ == CESkyCoordType::ECLIPTIC) {
        // ECLIPTIC -> GALACTIC
        Ecliptic2Galactic(*this, &galactic, date);
    }
    
    return galactic;
}